

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

void clunk::InitKnightMoves(int from)

{
  bool bVar1;
  int local_48;
  int to;
  int i;
  int shift;
  uint64_t mvs;
  int DIRECTION [8];
  int from_local;
  
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x1ee,"void clunk::InitKnightMoves(const int)");
  }
  DIRECTION[0] = -0x12;
  DIRECTION[1] = -0xe;
  DIRECTION[2] = 0xe;
  DIRECTION[3] = 0x12;
  DIRECTION[4] = 0x1f;
  DIRECTION[5] = 0x21;
  _i = 0;
  to = 0;
  local_48 = 0;
  do {
    if (7 < local_48) {
      bVar1 = VerifyMoveMap(from,_i);
      if (!bVar1) {
        __assert_fail("VerifyMoveMap(from, mvs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1fd,"void clunk::InitKnightMoves(const int)");
      }
      *(ulong *)(_knightMoves + (long)from * 8) = _i;
      return;
    }
    if ((from + DIRECTION[(long)local_48 + -2] & 0xffffff88U) == 0) {
      if (0x38 < to) {
        __assert_fail("shift <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1f8,"void clunk::InitKnightMoves(const int)");
      }
      _i = (long)(int)(from + DIRECTION[(long)local_48 + -2] + 1) << ((byte)to & 0x3f) | _i;
      to = to + 8;
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

void InitKnightMoves(const int from) {
  assert(IS_SQUARE(from));
  const int DIRECTION[8] = {
    KnightMove1, KnightMove2, KnightMove3, KnightMove4,
    KnightMove5, KnightMove6, KnightMove7, KnightMove8
  };
  uint64_t mvs = 0ULL;
  int shift = 0;
  for (int i = 0; i < 8; ++i) {
    const int to = (from + DIRECTION[i]);
    if (IS_SQUARE(to)) {
      assert(shift <= 56);
      mvs |= (uint64_t(to + 1) << shift);
      shift += 8;
    }
  }
  assert(VerifyMoveMap(from, mvs));
  _knightMoves[from] = mvs;
}